

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# specreaderimpl.cpp
# Opt level: O1

bool apngasm::spec::priv::anon_unknown_0::str2delay(string *str,Delay *pOut)

{
  pointer __s;
  bool bVar1;
  void *pvVar2;
  size_type __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (pOut != (Delay *)0x0) {
    if (str->_M_string_length == 0) {
      __n = 0xffffffffffffffff;
    }
    else {
      __s = (str->_M_dataplus)._M_p;
      pvVar2 = memchr(__s,0x2f,str->_M_string_length);
      __n = -(ulong)(pvVar2 == (void *)0x0) | (long)pvVar2 - (long)__s;
    }
    if (__n == 0xffffffffffffffff) {
      bVar1 = s2u(str,&pOut->num);
      if (bVar1) {
        pOut->den = 1000;
        return true;
      }
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_38,str,0,__n);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_58,str,__n + 1,str->_M_string_length);
      bVar1 = s2u(&local_38,&pOut->num);
      if ((bVar1) && (bVar1 = s2u(&local_58,&pOut->den), bVar1)) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
        return true;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return false;
}

Assistant:

bool str2delay(const std::string& str, Delay* pOut)
        {
          if(pOut == NULL)
            return false;

          static const char delimiter = '/';
          const std::string::size_type index = str.find(delimiter, 0);

          // Numerator only.
          if(index == std::string::npos)
          {
            if( !s2u(str, &pOut->num) )
              return false;
            pOut->den = DEFAULT_FRAME_DENOMINATOR;
          }

          // Numerator / Denominator
          else
          {
            const std::string& num = str.substr(0, index);
            const std::string& den = str.substr(index+1, str.length());

            if( !s2u(num, &pOut->num) || !s2u(den, &pOut->den) )
              return false;
          }

          return true;
        }